

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:240:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:240:17)>
            *this)

{
  long *plVar1;
  WirePointer *pWVar2;
  void *pvVar3;
  undefined8 *puVar4;
  Own<capnp::MembranePolicy,_std::nullptr_t> *in_R9;
  Own<capnp::ClientHook,_std::nullptr_t> OVar5;
  Orphanage OVar6;
  Orphanage to;
  Builder root;
  MallocMessageBuilder insideBuilder;
  MallocMessageBuilder outsideBuilder;
  CapTableReader local_2c8;
  long *local_2c0;
  PointerBuilder local_2b8;
  undefined1 local_298 [16];
  WirePointer *local_288;
  WirePointer *local_280;
  OrphanBuilder local_268;
  Builder local_248;
  StructBuilder local_230;
  MallocMessageBuilder local_208;
  MallocMessageBuilder local_118;
  
  capnp::MallocMessageBuilder::MallocMessageBuilder(&local_118,0x400,GROW_HEURISTICALLY);
  capnp::MessageBuilder::getRootInternal((Builder *)local_298,&local_118.super_MessageBuilder);
  local_208.super_MessageBuilder.arenaSpace[1] = local_288;
  local_208.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_298._0_8_;
  local_208.super_MessageBuilder.arenaSpace[0] = (void *)local_298._8_8_;
  capnp::_::PointerBuilder::initStruct(&local_230,(PointerBuilder *)&local_208,(StructSize)0x20000);
  puVar4 = (undefined8 *)operator_new(0x28);
  local_208.super_MessageBuilder.arenaSpace[0] = puVar4 + 3;
  puVar4[4] = 0;
  *puVar4 = 0x6e24d0;
  puVar4[3] = 0x6e2510;
  puVar4[1] = "inside";
  puVar4[2] = 7;
  local_208.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::ThingImpl>::instance;
  OVar5 = capnp::Capability::Client::makeLocalClient
                    ((Client *)(local_298 + 8),
                     (Own<capnp::Capability::Server,_std::nullptr_t> *)&local_208);
  pvVar3 = local_208.super_MessageBuilder.arenaSpace[0];
  if ((long *)local_208.super_MessageBuilder.arenaSpace[0] != (long *)0x0) {
    local_208.super_MessageBuilder.arenaSpace[0] = (void *)0x0;
    (**(code **)*local_208.super_MessageBuilder._vptr_MessageBuilder)
              (local_208.super_MessageBuilder._vptr_MessageBuilder,
               (long)pvVar3 + *(long *)(*pvVar3 + -0x10),OVar5.ptr);
  }
  local_298._0_8_ = &capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  local_208.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_230.segment;
  local_208.super_MessageBuilder.arenaSpace[0] = local_230.capTable;
  local_208.super_MessageBuilder.arenaSpace[1] = local_230.pointers;
  capnp::_::PointerBuilder::setCapability
            ((PointerBuilder *)&local_208,(Own<capnp::ClientHook,_std::nullptr_t> *)(local_298 + 8))
  ;
  pWVar2 = local_288;
  if (local_288 != (WirePointer *)0x0) {
    local_288 = (WirePointer *)0x0;
    (*(code *)((SegmentReader *)local_298._8_8_)->arena->_vptr_Arena)
              (local_298._8_8_,
               (long)&(pWVar2->offsetAndKind).value +
               *(long *)(*(long *)&pWVar2->offsetAndKind + -0x10));
  }
  capnp::MallocMessageBuilder::MallocMessageBuilder(&local_208,0x400,GROW_HEURISTICALLY);
  capnp::_::StructBuilder::asReader(&local_230);
  OVar6 = capnp::MessageBuilder::getOrphanage(&local_208.super_MessageBuilder);
  (*(((((this->f).env)->policy).ptr)->super_MembranePolicy)._vptr_MembranePolicy[2])(&local_2c8);
  to.capTable = (CapTableBuilder *)&local_2c8;
  to.arena = (BuilderArena *)OVar6.capTable;
  capnp::copyOutOfMembrane<capnproto_test::capnp::test::TestContainMembrane::Reader>
            ((Orphan<capnproto_test::capnp::test::TestContainMembrane> *)&local_268,
             (capnp *)local_298,(Reader *)OVar6.arena,to,in_R9);
  capnp::MessageBuilder::getRootInternal(&local_248,&local_208.super_MessageBuilder);
  local_2b8.pointer = local_248.builder.pointer;
  local_2b8.segment = local_248.builder.segment;
  local_2b8.capTable = local_248.builder.capTable;
  capnp::_::PointerBuilder::adopt(&local_2b8,&local_268);
  if (local_268.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&local_268);
  }
  plVar1 = local_2c0;
  if (local_2c0 != (long *)0x0) {
    local_2c0 = (long *)0x0;
    (**(code **)*local_2c8._vptr_CapTableReader)
              (local_2c8._vptr_CapTableReader,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  capnp::MessageBuilder::getRootInternal((Builder *)&local_2b8,&local_208.super_MessageBuilder);
  local_268.capTable = (CapTableBuilder *)local_2b8.pointer;
  local_268.tag.content = (uint64_t)local_2b8.segment;
  local_268.segment = (SegmentBuilder *)local_2b8.capTable;
  capnp::_::PointerBuilder::getStruct
            ((StructBuilder *)local_298,(PointerBuilder *)&local_268,(StructSize)0x20000,(word *)0x0
            );
  local_268.tag.content = local_298._0_8_;
  local_268.segment = (SegmentBuilder *)local_298._8_8_;
  local_268.capTable = (CapTableBuilder *)local_280;
  capnp::_::PointerBuilder::getCapability(&local_2b8);
  *(SegmentBuilder **)&__return_storage_ptr__->field_0x8 = local_2b8.segment;
  *(CapTableBuilder **)&__return_storage_ptr__->field_0x10 = local_2b8.capTable;
  local_2b8.capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->_vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  capnp::MallocMessageBuilder::~MallocMessageBuilder(&local_208);
  capnp::MallocMessageBuilder::~MallocMessageBuilder(&local_118);
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }